

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Serializer.cpp
# Opt level: O2

void __thiscall
adios2::format::BP4Serializer::SerializeMetadataInData
          (BP4Serializer *this,bool updateAbsolutePosition,bool inData)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex>_>_>
  *indices;
  vector<char,_std::allocator<char>_> *buffer;
  anon_class_1_0_00000001 *this_00;
  _func_int *p_Var1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  uint64_t pgIndexStart;
  long lVar4;
  uint64_t *in_RCX;
  undefined7 in_register_00000011;
  code *pcVar5;
  undefined7 in_register_00000031;
  pointer pcVar6;
  size_t *in_R9;
  size_t size;
  size_t __n;
  uint32_t attributesCount;
  uint32_t varsCount;
  uint64_t attributesLength;
  uint64_t varsLength;
  allocator local_95;
  undefined4 local_94;
  undefined1 local_90 [8];
  size_type local_88;
  __node_base local_80;
  __node_base_ptr local_78;
  long local_70;
  size_t local_68;
  __node_base_ptr local_60;
  long local_58;
  string local_50;
  
  p_Var1 = (this->super_BP4Base)._vptr_BP4Base[-3];
  this_00 = (anon_class_1_0_00000001 *)(&(this->super_BP4Base).field_0x128 + (long)p_Var1);
  local_68 = *(size_t *)(this_00 + 0x78);
  p_Var2 = *(_Hash_node_base **)(this_00 + -0x40);
  p_Var3 = *(_Hash_node_base **)(this_00 + -0x38);
  local_90._4_4_ = 0;
  local_58 = 0;
  SerializeMetadataInData::anon_class_1_0_00000001::operator()
            (this_00,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex>_>_>
                      *)(local_90 + 4),(uint32_t *)&local_58,in_RCX);
  local_90._0_4_ = 0;
  local_60 = (__node_base_ptr)0x0;
  SerializeMetadataInData::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)(&(this->super_BP4Base).field_0x160 + (long)p_Var1),
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex>_>_>
              *)local_90,(uint32_t *)&local_60,in_RCX);
  if ((int)CONCAT71(in_register_00000011,inData) != 0) {
    local_94 = (undefined4)CONCAT71(in_register_00000031,updateAbsolutePosition);
    __n = (long)p_Var3 - (long)p_Var2;
    local_70 = local_58;
    local_78 = local_60;
    local_88 = (long)local_60 +
               (ulong)*(uint *)(&(this->super_BP4Base).field_0x198 + (long)p_Var1) + __n + local_58
               + 0x28;
    size = *(long *)(p_Var1 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer) +
           local_88;
    local_80._M_nxt = p_Var2;
    std::__cxx11::string::string
              ((string *)&local_50," when writing metadata in bp data buffer",&local_95);
    BufferSTL::Resize((BufferSTL *)
                      (p_Var1 + 0x28 + (long)&(this->super_BP4Base).m_MetadataIndexTable._M_h),size,
                      &local_50);
    indices = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex>_>_>
               *)(p_Var1 + 0x30 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer);
    buffer = (vector<char,_std::allocator<char>_> *)
             (p_Var1 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer);
    pcVar5 = p_Var1 + 0x28 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer;
    std::__cxx11::string::~string((string *)&local_50);
    *(size_t *)
     ((long)(indices->_M_h)._M_buckets +
     (long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start) = local_68;
    pcVar6 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_start = pcVar6 + 8;
    *(size_t *)((long)(indices->_M_h)._M_buckets + (long)(pcVar6 + 8)) = __n;
    pcVar6 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start + 8;
    (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_start = pcVar6;
    if (p_Var3 != local_80._M_nxt) {
      memmove(pcVar6 + (long)(indices->_M_h)._M_buckets,
              *(void **)(&(this->super_BP4Base).field_0xe8 +
                        (long)(this->super_BP4Base)._vptr_BP4Base[-3]),__n);
      pcVar6 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    lVar4 = local_70;
    (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_start = pcVar6 + __n;
    SerializeMetadataInData::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)(ulong)(uint)local_90._4_4_,(uint32_t)local_70,
               (uint64_t)
               (&(this->super_BP4Base).field_0x128 + (long)(this->super_BP4Base)._vptr_BP4Base[-3]),
               indices,buffer,in_R9);
    SerializeMetadataInData::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)(ulong)(uint)local_90._0_4_,(uint32_t)local_78,
               (uint64_t)
               (&(this->super_BP4Base).field_0x160 + (long)(this->super_BP4Base)._vptr_BP4Base[-3]),
               indices,buffer,in_R9);
    pgIndexStart = *(uint64_t *)pcVar5;
    BPSerializer::PutMinifooter
              ((BPSerializer *)&(this->super_BP4Base).field_0xa0,pgIndexStart,
               __n + pgIndexStart + 0x10,lVar4 + __n + pgIndexStart + 0x1c,
               (vector<char,_std::allocator<char>_> *)indices,(size_t *)buffer,false);
    if ((char)local_94 != '\0') {
      *(uint64_t *)pcVar5 = *(uint64_t *)pcVar5 + local_88;
    }
    p_Var1 = (this->super_BP4Base)._vptr_BP4Base[-3];
    if ((&(this->super_BP4Base).field_0x2e8)[(long)p_Var1] == '\x01') {
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<char_const(&)[10],unsigned_long&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)(&(this->super_BP4Base).field_0x2b0 + (long)p_Var1),"buffering",pcVar5);
    }
  }
  return;
}

Assistant:

void BP4Serializer::SerializeMetadataInData(const bool updateAbsolutePosition, const bool inData)
{
    auto lf_SetIndexCountLength = [](std::unordered_map<std::string, SerialElementIndex> &indices,
                                     uint32_t &count, uint64_t &length) {
        count = static_cast<uint32_t>(indices.size());
        length = 0;
        for (auto &indexPair : indices) // set each index length
        {
            auto &indexBuffer = indexPair.second.Buffer;
            // const uint32_t indexLength =
            //     static_cast<uint32_t>(indexBuffer.size() - 4);
            // size_t indexLengthPosition = 0;
            // helper::CopyToBuffer(indexBuffer, indexLengthPosition,
            //                      &indexLength);

            length += indexBuffer.size(); // overall length
        }
    };

    auto lf_FlattenIndices = [](const uint32_t count, const uint64_t length,
                                const std::unordered_map<std::string, SerialElementIndex> &indices,
                                std::vector<char> &buffer, size_t &position) {
        helper::CopyToBuffer(buffer, position, &count);
        helper::CopyToBuffer(buffer, position, &length);

        for (const auto &indexPair : indices) // set each index length
        {
            const auto &indexBuffer = indexPair.second.Buffer;
            helper::CopyToBuffer(buffer, position, indexBuffer.data(), indexBuffer.size());
        }
    };

    // Finish writing metadata counts and lengths
    // PG Index
    const uint64_t pgCount = m_MetadataSet.DataPGCount;
    const uint64_t pgLength = m_MetadataSet.PGIndex.Buffer.size();

    // var index count and length (total), and each index length
    uint32_t varsCount = 0;
    uint64_t varsLength = 0;
    lf_SetIndexCountLength(m_MetadataSet.VarsIndices, varsCount, varsLength);

    // attribute index count and length, and each index length
    uint32_t attributesCount = 0;
    uint64_t attributesLength = 0;
    lf_SetIndexCountLength(m_MetadataSet.AttributesIndices, attributesCount, attributesLength);

    if (!inData)
    {
        return;
    }

    const size_t footerSize =
        static_cast<size_t>((pgLength + 16) + (varsLength + 12) + (attributesLength + 12) +
                            m_MetadataSet.MiniFooterSize);

    auto &buffer = m_Data.m_Buffer;
    auto &position = m_Data.m_Position;
    auto &absolutePosition = m_Data.m_AbsolutePosition;

    // reserve data to fit metadata,
    // must replace with growth buffer strategy?
    m_Data.Resize(position + footerSize, " when writing metadata in bp data buffer");

    // write pg index
    helper::CopyToBuffer(buffer, position, &pgCount);
    helper::CopyToBuffer(buffer, position, &pgLength);
    helper::CopyToBuffer(buffer, position, m_MetadataSet.PGIndex.Buffer.data(),
                         static_cast<size_t>(pgLength));

    // Vars indices
    lf_FlattenIndices(varsCount, varsLength, m_MetadataSet.VarsIndices, buffer, position);
    // Attribute indices
    lf_FlattenIndices(attributesCount, attributesLength, m_MetadataSet.AttributesIndices, buffer,
                      position);

    // getting absolute offset start, minifooter is 28 bytes for now
    const uint64_t pgIndexStart = static_cast<uint64_t>(absolutePosition);
    const uint64_t variablesIndexStart = static_cast<uint64_t>(pgIndexStart + (pgLength + 16));
    const uint64_t attributesIndexStart =
        static_cast<uint64_t>(variablesIndexStart + (varsLength + 12));

    PutMinifooter(pgIndexStart, variablesIndexStart, attributesIndexStart, buffer, position);

    if (updateAbsolutePosition)
    {
        absolutePosition += footerSize;
    }

    if (m_Profiler.m_IsActive)
    {
        m_Profiler.m_Bytes.emplace("buffering", absolutePosition);
    }
}